

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O0

void __thiscall argagg::fmt_ostream::~fmt_ostream(fmt_ostream *this,void **vtt)

{
  ostream *poVar1;
  string local_58 [32];
  argagg local_38 [32];
  void **local_18;
  void **vtt_local;
  fmt_ostream *this_local;
  
  (this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
       = (_func_int **)*vtt;
  *(void **)((long)&(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream +
            (long)(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
                  _vptr_basic_ostream[-3]) = vtt[5];
  poVar1 = *(ostream **)
            &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
             field_0x70;
  local_18 = vtt;
  vtt_local = (void **)this;
  std::__cxx11::ostringstream::str();
  fmt_string(local_38,local_58);
  std::operator<<(poVar1,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  return;
}

Assistant:

inline
fmt_ostream::~fmt_ostream()
{
  output << fmt_string(this->str());
}